

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.cpp
# Opt level: O2

uint __thiscall
FMB::FiniteModelMultiSorted::evaluateGroundTerm(FiniteModelMultiSorted *this,Term *term)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  pair<unsigned_int,_unsigned_int> pVar4;
  UserErrorException *this_00;
  OperatorType *this_01;
  TermList TVar5;
  ulong uVar6;
  int iVar7;
  uint idx;
  ulong size;
  DArray<unsigned_int> args;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar2 = isDomainConstant(this,term);
  if (bVar2) {
    pVar4 = getDomainConstant(this,term);
    uVar3 = pVar4.first;
  }
  else {
    size = (ulong)*(uint *)(*(long *)(*(long *)(DAT_00a14190 + 0x60) + (long)(int)term->_functor * 8
                                     ) + 0x20);
    Lib::DArray<unsigned_int>::DArray(&args,size);
    iVar7 = 0;
    uVar6 = 0;
    while (size != uVar6) {
      uVar3 = evaluateGroundTerm(this,(Term *)term->_args
                                              [(int)((*(uint *)&term->field_0xc & 0xfffffff) + iVar7
                                                    )]._content);
      args._array[uVar6] = uVar3;
      uVar6 = uVar6 + 1;
      iVar7 = iVar7 + -1;
      if (uVar3 == 0) {
        this_00 = (UserErrorException *)__cxa_allocate_exception(0x50);
        Kernel::Term::toString_abi_cxx11_(&local_70,term,true);
        std::operator+(&local_50,"Could not evaluate ",&local_70);
        Lib::UserErrorException::Exception(this_00,&local_50);
        __cxa_throw(this_00,&Lib::UserErrorException::typeinfo,
                    Lib::UserErrorException::~UserErrorException);
      }
    }
    this_01 = Kernel::Signature::Symbol::fnType
                        (*(Symbol **)(*(long *)(DAT_00a14190 + 0x60) + (ulong)term->_functor * 8));
    uVar3 = (this->_f_offsets)._array[term->_functor];
    iVar7 = 1;
    for (idx = 0; idx < args._size; idx = idx + 1) {
      uVar1 = args._array[idx];
      TVar5 = Kernel::OperatorType::arg(this_01,idx);
      uVar3 = uVar3 + (uVar1 - 1) * iVar7;
      iVar7 = iVar7 * (this->_sizes)._array[*(uint *)(TVar5._content + 8)];
    }
    uVar3 = (this->_f_interpretation)._array[uVar3];
    Lib::DArray<unsigned_int>::~DArray(&args);
  }
  return uVar3;
}

Assistant:

unsigned FiniteModelMultiSorted::evaluateGroundTerm(Term* term)
{
  ASS(term->ground());

#if DEBUG_MODEL
  cout << "evaluating ground term " << term->toString() << endl;
  cout << "domain constant status " << isDomainConstant(term) << endl;
#endif
  if(isDomainConstant(term)) return getDomainConstant(term).first;

  unsigned arity = env.signature->functionArity(term->functor());
  DArray<unsigned> args(arity);
  for(unsigned i=0;i<arity;i++){
    args[i] = evaluateGroundTerm(term->nthArgument(i)->term());
    if(args[i]==0) USER_ERROR("Could not evaluate "+term->toString());
  }

  OperatorType* sig = env.signature->getFunction(term->functor())->fnType();
  unsigned var = _f_offsets[term->functor()];
  unsigned mult = 1;
  for(unsigned i=0;i<args.size();i++){
    var += mult*(args[i]-1);
    unsigned s = sig->arg(i).term()->functor();
    mult *=_sizes[s];
  }
#if VDEBUG
  if((term->functor()+1)<_f_offsets.size()) ASS_L(var,_f_offsets[term->functor()+1]);
#endif
  ASS_L(var,_f_interpretation.size());

  return _f_interpretation[var];
}